

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_write_json(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *this,NodeScalar *sc,NodeType flags)

{
  uint uVar1;
  
  if (((sc->tag).len != 0) && ((sc->tag).str != (char *)0x0)) {
    Emitter<c4::yml::WriterOStream<std::__cxx11::ostringstream>>::_write_json();
  }
  if ((flags.type & (VALANCH|KEYANCH)) != NOTYPE) {
    Emitter<c4::yml::WriterOStream<std::__cxx11::ostringstream>>::_write_json();
  }
  uVar1 = ~(uint)flags.type;
  _write_scalar_json(this,sc->scalar,SUB41(((uint)flags.type & 2) >> 1,0),
                     (uVar1 & 0x1001) == 0 || (uVar1 & 0x2002) == 0);
  return;
}

Assistant:

void Emitter<Writer>::_write_json(NodeScalar const& C4_RESTRICT sc, NodeType flags)
{
    if(C4_UNLIKELY( ! sc.tag.empty()))
        _RYML_CB_ERR(m_tree->callbacks(), "JSON does not have tags");
    if(C4_UNLIKELY(flags.has_anchor()))
        _RYML_CB_ERR(m_tree->callbacks(), "JSON does not have anchors");
    _write_scalar_json(sc.scalar, flags.has_key(), flags.is_quoted());
}